

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTPNDstrBase::CTPNDstrBase(CTPNDstrBase *this,char *str,size_t len)

{
  size_t in_RDX;
  size_t in_RSI;
  CTcGenTarg *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  CTcPrsNode::CTcPrsNode((CTcPrsNode *)in_RDI);
  *(undefined ***)in_RDI = &PTR___cxa_pure_virtual_003d0088;
  in_RDI->max_str_len_ = in_RSI;
  in_RDI->max_list_cnt_ = in_RDX;
  CTcGenTarg::note_str(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

CTPNDstrBase::CTPNDstrBase(const char *str, size_t len)
{
    /* remember the string */
    str_ = str;
    len_ = len;

    /* 
     *   note the length in the parser, in case it's the longest string
     *   we've seen so far 
     */
    G_cg->note_str(len);
}